

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.h
# Opt level: O0

void __thiscall
agge::renderer::
adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
::operator()(adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
             *this,int x,int length,cover_type *covers)

{
  int iVar1;
  cover_type *pcStack_20;
  int dx;
  cover_type *covers_local;
  int length_local;
  int x_local;
  adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
  *this_local;
  
  pcStack_20 = covers;
  covers_local._0_4_ = length;
  covers_local._4_4_ = x;
  if (x < (this->_window).x1) {
    iVar1 = x - (this->_window).x1;
    covers_local._4_4_ = (this->_window).x1;
    covers_local._0_4_ = iVar1 + length;
    pcStack_20 = covers + -(long)iVar1;
  }
  _length_local = this;
  update_min<int>((int *)&covers_local,(this->_window).x2 - covers_local._4_4_);
  if (0 < (int)(uint)covers_local) {
    agge::tests::mocks::blender<unsigned_char,_unsigned_char>::operator()
              (this->_blender,this->_row + covers_local._4_4_,covers_local._4_4_,this->_y,
               (uint)covers_local,pcStack_20);
  }
  return;
}

Assistant:

inline void renderer::adapter<BitmapT, BlenderT>::operator ()(int x, int length, const cover_type *covers)
	{
		if (x < _window.x1)
		{
			const int dx = x - _window.x1;

			x = _window.x1;
			length += dx;
			covers -= dx;
		}
		update_min(length, _window.x2 - x);
		if (length > 0)
			_blender(_row + x, x, _y, length, covers);
	}